

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *result)

{
  int *piVar1;
  iterator __position;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  size_type sVar7;
  ostream *poVar8;
  ulong *puVar9;
  pointer pbVar10;
  int iVar11;
  string resultFound;
  string regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  ostringstream ostr;
  RegularExpression leakWarning;
  RegularExpression sanitizerWarning;
  ulong *local_6c0;
  long local_6b8;
  ulong local_6b0;
  long lStack_6a8;
  string local_6a0;
  cmCTestMemCheckHandler *local_680;
  undefined1 *local_678;
  undefined8 local_670;
  undefined1 local_668;
  undefined7 uStack_667;
  char *local_658;
  undefined8 local_650;
  char local_648;
  undefined7 uStack_647;
  string *local_638;
  vector<int,_std::allocator<int>_> *local_630;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  undefined1 local_608 [376];
  RegularExpression local_490;
  RegularExpression local_260;
  
  local_658 = &local_648;
  local_650 = 0;
  local_648 = '\0';
  uVar5 = this->MemoryTesterStyle - 6;
  local_680 = this;
  if ((uVar5 < 5) && ((0x1dU >> (uVar5 & 0x1f) & 1) != 0)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_658,0,(char *)0x0,
               (ulong)(&DAT_0087d688 + *(int *)(&DAT_0087d688 + (ulong)uVar5 * 4)));
  }
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  cmsys::RegularExpression::compile(&local_260,local_658);
  local_490.regmust = (char *)0x0;
  local_490.program = (char *)0x0;
  local_490.progsize = 0;
  memset(&local_490,0,0x20a);
  cmsys::RegularExpression::compile(&local_490,"(Direct|Indirect) leak of .*");
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&local_628);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
  pbVar3 = local_628.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  iVar11 = 0;
  local_638 = log;
  if (local_628.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_628.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_630 = result;
    do {
      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
      local_6a0._M_string_length = 0;
      local_6a0.field_2._M_local_buf[0] = '\0';
      bVar4 = cmsys::RegularExpression::find
                        (&local_490,(pbVar10->_M_dataplus)._M_p,&local_490.regmatch);
      if (bVar4) {
        if (local_490.regmatch.startp[1] == (char *)0x0) {
          local_678 = &local_668;
          local_670 = 0;
          local_668 = 0;
        }
        else {
          local_678 = &local_668;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_678,local_490.regmatch.startp[1],local_490.regmatch.endp[1]);
        }
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_678);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_6b0 = *puVar9;
          lStack_6a8 = plVar6[3];
          local_6c0 = &local_6b0;
        }
        else {
          local_6b0 = *puVar9;
          local_6c0 = (ulong *)*plVar6;
        }
        local_6b8 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6a0,(string *)&local_6c0);
        if (local_6c0 != &local_6b0) {
          operator_delete(local_6c0,local_6b0 + 1);
        }
        if (local_678 != &local_668) {
          operator_delete(local_678,CONCAT71(uStack_667,local_668) + 1);
        }
      }
      else {
        bVar4 = cmsys::RegularExpression::find
                          (&local_260,(pbVar10->_M_dataplus)._M_p,&local_260.regmatch);
        if (bVar4) {
          if (local_260.regmatch.startp[1] == (char *)0x0) {
            local_6c0 = &local_6b0;
            local_6b8 = 0;
            local_6b0 = local_6b0 & 0xffffffffffffff00;
          }
          else {
            local_6c0 = &local_6b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6c0,local_260.regmatch.startp[1],local_260.regmatch.endp[1])
            ;
          }
          std::__cxx11::string::operator=((string *)&local_6a0,(string *)&local_6c0);
          result = local_630;
          if (local_6c0 != &local_6b0) {
            operator_delete(local_6c0,local_6b0 + 1);
            result = local_630;
          }
        }
      }
      if (local_6a0._M_string_length != 0) {
        sVar7 = FindOrAddWarning(local_680,&local_6a0);
        piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __position._M_current =
             (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if ((piVar1 == __position._M_current) ||
           (((long)__position._M_current - (long)piVar1 >> 2) - 1U < sVar7)) {
          local_6c0 = (ulong *)CONCAT44(local_6c0._4_4_,1);
          if (__position._M_current ==
              (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (result,__position,(int *)&local_6c0);
          }
          else {
            *__position._M_current = 1;
            (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
        else {
          piVar1[sVar7] = piVar1[sVar7] + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_608,"<b>",3);
        pbVar2 = (local_680->ResultStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_608,pbVar2[sVar7]._M_dataplus._M_p,
                            pbVar2[sVar7]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</b> ",5);
        iVar11 = iVar11 + 1;
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_608,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length
                         );
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p,
                        CONCAT71(local_6a0.field_2._M_allocated_capacity._1_7_,
                                 local_6a0.field_2._M_local_buf[0]) + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_638,(string *)&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,
                    CONCAT71(local_6a0.field_2._M_allocated_capacity._1_7_,
                             local_6a0.field_2._M_local_buf[0]) + 1);
  }
  local_680->DefectCount = local_680->DefectCount + iVar11;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
  std::ios_base::~ios_base((ios_base *)(local_608 + 0x70));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_628);
  if (local_490.program != (char *)0x0) {
    operator_delete__(local_490.program);
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  if (local_658 != &local_648) {
    operator_delete(local_658,CONCAT71(uStack_647,local_648) + 1);
  }
  return iVar11 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput(
  const std::string& str, std::string& log, std::vector<int>& result)
{
  std::string regex;
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      regex = "ERROR: AddressSanitizer: (.*) on.*";
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      // use leakWarning regex
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      regex = "WARNING: ThreadSanitizer: (.*) \\(pid=.*\\)";
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      regex = "WARNING: MemorySanitizer: (.*)";
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      regex = "runtime error: (.*)";
      break;
    default:
      break;
  }
  cmsys::RegularExpression sanitizerWarning(regex);
  cmsys::RegularExpression leakWarning("(Direct|Indirect) leak of .*");
  int defects = 0;
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();
  for (std::string const& l : lines) {
    std::string resultFound;
    if (leakWarning.find(l)) {
      resultFound = leakWarning.match(1) + " leak";
    } else if (sanitizerWarning.find(l)) {
      resultFound = sanitizerWarning.match(1);
    }
    if (!resultFound.empty()) {
      std::vector<int>::size_type idx = this->FindOrAddWarning(resultFound);
      if (result.empty() || idx > result.size() - 1) {
        result.push_back(1);
      } else {
        result[idx]++;
      }
      defects++;
      ostr << "<b>" << this->ResultStrings[idx] << "</b> ";
    }
    ostr << l << std::endl;
  }
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}